

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::BasicGraphicsTestInstance::buildVertexBuffer
          (BasicGraphicsTestInstance *this)

{
  RefData<vk::Handle<(vk::HandleType)8>_> data;
  VkDevice device;
  VkDevice vkd;
  Allocation *pAVar1;
  void *dst;
  Vertex4RGBA *src;
  size_type sVar2;
  VkDeviceMemory memory;
  VkDeviceSize offset;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> local_88;
  Move<vk::Handle<(vk::HandleType)8>_> local_60;
  RefData<vk::Handle<(vk::HandleType)8>_> local_40;
  VkDevice local_20;
  VkDevice vkDevice;
  DeviceInterface *vk;
  BasicGraphicsTestInstance *this_local;
  
  vk = (DeviceInterface *)this;
  vkDevice = (VkDevice)
             Context::getDeviceInterface
                       ((this->super_TimestampTestInstance).super_TestInstance.m_context);
  local_20 = Context::getDevice((this->super_TimestampTestInstance).super_TestInstance.m_context);
  TimestampTestInstance::createBufferAndBindMemory
            (&local_60,&this->super_TimestampTestInstance,0x400,0x80,&this->m_vertexBufferAlloc);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_40,(Move *)&local_60);
  data.deleter.m_deviceIface = local_40.deleter.m_deviceIface;
  data.object.m_internal = local_40.object.m_internal;
  data.deleter.m_device = local_40.deleter.m_device;
  data.deleter.m_allocator = local_40.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_vertexBuffer,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_60);
  createOverlappingQuads();
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::operator=
            (&this->m_vertices,&local_88);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
            (&local_88);
  pAVar1 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_vertexBufferAlloc).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  dst = ::vk::Allocation::getHostPtr(pAVar1);
  src = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::data
                  (&this->m_vertices);
  sVar2 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::size
                    (&this->m_vertices);
  ::deMemcpy(dst,src,sVar2 << 5);
  vkd = vkDevice;
  device = local_20;
  pAVar1 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_vertexBufferAlloc).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  memory = ::vk::Allocation::getMemory(pAVar1);
  pAVar1 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_vertexBufferAlloc).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  offset = ::vk::Allocation::getOffset(pAVar1);
  ::vk::flushMappedMemoryRange((DeviceInterface *)vkd,device,memory,offset,0x400);
  return;
}

Assistant:

void BasicGraphicsTestInstance::buildVertexBuffer(void)
{
	const DeviceInterface&      vk       = m_context.getDeviceInterface();
	const VkDevice              vkDevice = m_context.getDevice();

	// Create vertex buffer
	{
		m_vertexBuffer = createBufferAndBindMemory(1024u, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT, &m_vertexBufferAlloc);

		m_vertices          = createOverlappingQuads();
		// Load vertices into vertex buffer
		deMemcpy(m_vertexBufferAlloc->getHostPtr(), m_vertices.data(), m_vertices.size() * sizeof(Vertex4RGBA));
		flushMappedMemoryRange(vk, vkDevice, m_vertexBufferAlloc->getMemory(), m_vertexBufferAlloc->getOffset(), 1024u);
	}
}